

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

void __thiscall mocker::ir::Builder::operator()(Builder *this,ReturnStmt *node)

{
  element_type *peVar1;
  BuilderContext *this_00;
  element_type *local_28;
  BBLIter BStack_20;
  
  peVar1 = (node->expr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = this->ctx;
  }
  else {
    (*(peVar1->super_ASTNode)._vptr_ASTNode[3])
              (peVar1,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    this_00 = this->ctx;
    if ((node->expr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      BuilderContext::getExprAddr((BuilderContext *)&stack0xffffffffffffffd8,(NodeID)this_00);
      goto LAB_0013f73a;
    }
  }
  local_28 = (element_type *)0x0;
  BStack_20._M_node = (_List_node_base *)0x0;
LAB_0013f73a:
  BuilderContext::emplaceInst<mocker::ir::Ret,std::shared_ptr<mocker::ir::Addr>>
            (this_00,(shared_ptr<mocker::ir::Addr> *)&stack0xffffffffffffffd8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BStack_20._M_node !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BStack_20._M_node);
  }
  return;
}

Assistant:

void Builder::operator()(const ast::ReturnStmt &node) const {
  if (node.expr)
    visit(*node.expr);
  ctx.emplaceInst<Ret>(node.expr ? ctx.getExprAddr(node.expr->getID())
                                 : nullptr);
}